

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Account.cpp
# Opt level: O1

void __thiscall L13_3::BankAccount::withdraw(BankAccount *this,double amount)

{
  double *pdVar1;
  ostream *poVar2;
  
  if (amount < 0.0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Withdraw failed. negative value(",0x20);
    poVar2 = std::ostream::_M_insert<double>(amount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") not allowed.\n",0xf);
    return;
  }
  pdVar1 = &(this->super_Account)._balance;
  if (*pdVar1 <= amount && amount != *pdVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Withdraw failed. not enough remaining balance.\n",0x2f);
    return;
  }
  Account::withdraw(&this->super_Account,amount);
  return;
}

Assistant:

void BankAccount::withdraw(double amount) {
        if (amount < 0) {
            cout << "Withdraw failed. negative value(" << amount << ") not allowed.\n";
            return;
        }
        if (amount > get_balance()) {
            cout << "Withdraw failed. not enough remaining balance.\n";
            return;
        }
        //  call ABC method
        Account::withdraw(amount);
    }